

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_some_gcd_and_equal_left_right(void)

{
  bool bVar1;
  undefined8 uVar2;
  uintwide_t<256U,_unsigned_short,_void,_false> *b;
  int in_R8D;
  bool local_13e;
  bool local_13d;
  bool local_13c;
  bool local_13a;
  bool result_gcd_right_zero_is_ok;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
  result_gcd_right_zero;
  bool result_gcd_left_zero_is_ok;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
  result_gcd_left_zero;
  bool result_gcd64_is_ok_3;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
  gcd64_3;
  bool result_gcd64_is_ok_2;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
  gcd64_2;
  bool result_gcd64_is_ok_1;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
  gcd64_1;
  bool result_gcd64_is_ok;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
  gcd64;
  bool result_gcd64_equal_checker_is_ok_4;
  bool result_gcd64_equal_checker_is_ok_3;
  bool result_gcd64_equal_checker_is_ok_2;
  bool result_gcd64_equal_checker_is_ok_1;
  bool result_gcd64_equal_checker_is_ok;
  anon_class_1_0_00000001 gcd64_equal_checker;
  undefined1 auStack_b8 [7];
  bool result_gcd_left_unequal_right_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> v_right;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  u_left;
  undefined1 auStack_52 [7];
  bool result_gcd_left_equal_right_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> right;
  uintwide_t<256U,_unsigned_short,_void,_false> left;
  bool result_gcd_is_ok;
  uint i;
  bool result_is_ok;
  
  result_gcd_is_ok = true;
  left.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  left.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  for (; (uint)left.values.super_array<unsigned_short,_16UL>.elems._26_4_ < 0x40;
      left.values.super_array<unsigned_short,_16UL>.elems._26_4_ =
           left.values.super_array<unsigned_short,_16UL>.elems._26_4_ + 1) {
    uVar2 = 0;
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (right.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (test_uintwide_t_edge *)0x1,false,0x4c,in_R8D);
    auStack_52._0_2_ = right.values.super_array<unsigned_short,_16UL>.elems[0xc];
    auStack_52._2_2_ = right.values.super_array<unsigned_short,_16UL>.elems[0xd];
    auStack_52._4_2_ = right.values.super_array<unsigned_short,_16UL>.elems[0xe];
    stack0xffffffffffffffb4 = right.values.super_array<unsigned_short,_16UL>.elems[0xf];
    right.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
         left.values.super_array<unsigned_short,_16UL>.elems._0_8_;
    right.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
         left.values.super_array<unsigned_short,_16UL>.elems._8_8_;
    right.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
         left.values.super_array<unsigned_short,_16UL>.elems._16_8_;
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (right.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)auStack_52);
    b = (uintwide_t<256U,_unsigned_short,_void,_false> *)CONCAT71((int7)((ulong)uVar2 >> 8),bVar1);
    local_13a = false;
    if (bVar1) {
      math::wide_integer::gcd<256u,unsigned_short,void,false>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (u_left.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 (wide_integer *)(right.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)auStack_52,b);
      local_13a = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                            ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                             (u_left.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                             (uintwide_t<256U,_unsigned_short,_void,_false> *)
                             (right.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    }
    v_right.values.super_array<unsigned_short,_16UL>.elems[0xc] = 1;
    v_right.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    math::wide_integer::operator+
              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)(v_right.values.super_array<unsigned_short,_16UL>.elems + 0xe),
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (right.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uint *)(v_right.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    auStack_b8._0_2_ = auStack_52._0_2_;
    auStack_b8._2_2_ = auStack_52._2_2_;
    auStack_b8._4_2_ = auStack_52._4_2_;
    stack0xffffffffffffff4e = stack0xffffffffffffffb4;
    v_right.values.super_array<unsigned_short,_16UL>.elems[0] =
         right.values.super_array<unsigned_short,_16UL>.elems[0];
    v_right.values.super_array<unsigned_short,_16UL>.elems[1] =
         right.values.super_array<unsigned_short,_16UL>.elems[1];
    v_right.values.super_array<unsigned_short,_16UL>.elems[2] =
         right.values.super_array<unsigned_short,_16UL>.elems[2];
    v_right.values.super_array<unsigned_short,_16UL>.elems[3] =
         right.values.super_array<unsigned_short,_16UL>.elems[3];
    v_right.values.super_array<unsigned_short,_16UL>.elems[4] =
         right.values.super_array<unsigned_short,_16UL>.elems[4];
    v_right.values.super_array<unsigned_short,_16UL>.elems[5] =
         right.values.super_array<unsigned_short,_16UL>.elems[5];
    v_right.values.super_array<unsigned_short,_16UL>.elems[6] =
         right.values.super_array<unsigned_short,_16UL>.elems[6];
    v_right.values.super_array<unsigned_short,_16UL>.elems[7] =
         right.values.super_array<unsigned_short,_16UL>.elems[7];
    v_right.values.super_array<unsigned_short,_16UL>.elems[8] =
         right.values.super_array<unsigned_short,_16UL>.elems[8];
    v_right.values.super_array<unsigned_short,_16UL>.elems[9] =
         right.values.super_array<unsigned_short,_16UL>.elems[9];
    v_right.values.super_array<unsigned_short,_16UL>.elems[10] =
         right.values.super_array<unsigned_short,_16UL>.elems[10];
    v_right.values.super_array<unsigned_short,_16UL>.elems[0xb] =
         right.values.super_array<unsigned_short,_16UL>.elems[0xb];
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator!=
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (v_right.values.super_array<unsigned_short,_16UL>.elems + 0xe),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)auStack_b8);
    local_13c = false;
    if (bVar1) {
      math::wide_integer::gcd<256u,unsigned_short,void,false>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&gcd64 + 6),
                 (wide_integer *)(v_right.values.super_array<unsigned_short,_16UL>.elems + 0xe),
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)auStack_b8,
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)
                 CONCAT71((int7)((ulong)b >> 8),bVar1));
      local_13c = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator!=
                            ((uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&gcd64 + 6),
                             (uintwide_t<256U,_unsigned_short,_void,_false> *)
                             (v_right.values.super_array<unsigned_short,_16UL>.elems + 0xe));
    }
    local_13d = local_13c != false && local_13a != false;
    local_13e = false;
    if (local_13d) {
      local_13e = result_gcd_is_ok;
    }
    result_gcd_is_ok = local_13e;
  }
  return result_gcd_is_ok;
}

Assistant:

auto test_some_gcd_and_equal_left_right() -> bool
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(64));
           ++i)
  {
    auto result_gcd_is_ok = true;

    const auto left =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::dec,
        static_cast<int>(std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits10 - static_cast<int>(INT8_C(1)))
      );

    const auto right = left;

    {
      const auto result_gcd_left_equal_right_is_ok = ((left == right) && (gcd(left, right) == left));

      result_gcd_is_ok = (result_gcd_left_equal_right_is_ok && result_gcd_is_ok);
    }

    {
      const auto u_left  = left + static_cast<unsigned>(UINT8_C(1));
      const auto v_right = right;

      const auto result_gcd_left_unequal_right_is_ok = ((u_left != v_right) && (gcd(u_left, v_right) != u_left));

      result_gcd_is_ok = (result_gcd_left_unequal_right_is_ok && result_gcd_is_ok);
    }

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  const auto gcd64_equal_checker =
    [](const std::size_t first, const std::size_t last_inclusive, const std::uint64_t right) // NOLINT(bugprone-easily-swappable-parameters)
    {
      #if defined(WIDE_INTEGER_NAMESPACE)
      using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
      #else
      using ::math::wide_integer::gcd;
      #endif

      auto left = static_cast<std::uint64_t>(local_edge_cases::small_integers[first]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

      for(auto ig = static_cast<std::size_t>(first + static_cast<std::size_t>(UINT8_C(1))); ig <= last_inclusive; ++ig) // NOLINT(altera-id-dependent-backward-branch)
      {
        left *= static_cast<std::uint64_t>(local_edge_cases::small_integers[ig]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)
      }

      const auto result_gcd_left_equal_right_is_ok = ((left == right) && (gcd(left, right) == left));

      return result_gcd_left_equal_right_is_ok;
    };

  {
    // Consider small prime factors from { 3 ...  53 }.
    // Product[Prime[i], {i, 2, 16}] = 16294579238595022365
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(2)),
        static_cast<std::size_t>(UINT8_C(16)),
        static_cast<std::uint64_t>(UINT64_C(16294579238595022365))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 59 ... 101 }.
    // Product[Prime[i], {i, 17, 26}] = 7145393598349078859
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(17)),
        static_cast<std::size_t>(UINT8_C(26)),
        static_cast<std::uint64_t>(UINT64_C(7145393598349078859))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 103 ... 149 }.
    // Product[Prime[i], {i, 27, 35}] = 6408001374760705163
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(27)),
        static_cast<std::size_t>(UINT8_C(35)),
        static_cast<std::uint64_t>(UINT64_C(6408001374760705163))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 151 ... 191 }.
    // Product[Prime[i], {i, 36, 43}] = 690862709424854779
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(36)),
        static_cast<std::size_t>(UINT8_C(43)),
        static_cast<std::uint64_t>(UINT64_C(690862709424854779))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 193 ... 227 }.
    // Product[Prime[i], {i, 44, 49}] = 80814592450549
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(44)),
        static_cast<std::size_t>(UINT8_C(49)),
        static_cast<std::uint64_t>(UINT64_C(80814592450549))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }

  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    // GCD[6170895419598858564, 1073014744210933590]
    // 594
    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(6170895419598858564)),
                           static_cast<std::uint64_t>(UINT64_C(1073014744210933590)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(594)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    // GCD[20769612331917304, 11556552886528217295]
    // 6673

    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(20769612331917304)),
                           static_cast<std::uint64_t>(UINT64_C(11556552886528217295)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(6673)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    // GCD[3263830144632800334, 9189394046487653520]
    // 56598

    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(3263830144632800334)),
                           static_cast<std::uint64_t>(UINT64_C(9189394046487653520)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(56598)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    // GCD[7515843862511910988, 11558893357905095758]
    // 420278

    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(7515843862511910988)),
                           static_cast<std::uint64_t>(UINT64_C(11558893357905095758)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(420278)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto result_gcd_left_zero = gcd(static_cast<std::uint64_t>(UINT64_C(7515843862511910988)),
                                          static_cast<std::uint64_t>(UINT64_C(0)));

    const auto result_gcd_left_zero_is_ok = (result_gcd_left_zero == static_cast<std::uint64_t>(UINT64_C(7515843862511910988)));

    result_is_ok = (result_gcd_left_zero_is_ok && result_is_ok);
  }

  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto result_gcd_right_zero = gcd(static_cast<std::uint64_t>(UINT64_C(0)),
                                           static_cast<std::uint64_t>(UINT64_C(7515843862511910988)));

    const auto result_gcd_right_zero_is_ok = (result_gcd_right_zero == static_cast<std::uint64_t>(UINT64_C(7515843862511910988)));

    result_is_ok = (result_gcd_right_zero_is_ok && result_is_ok);
  }

  return result_is_ok;
}